

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

bool __thiscall IntElemBoundsImp<0,_0,_0>::propagate(IntElemBoundsImp<0,_0,_0> *this)

{
  Reason r_00;
  Reason r_01;
  Reason r_02;
  Reason r_03;
  Reason r_04;
  Reason r_05;
  Reason r_06;
  Reason r_07;
  Reason r_08;
  Reason r_09;
  Reason r_10;
  Reason r_11;
  Reason r_12;
  Reason r_13;
  initializer_list<Lit> __l;
  initializer_list<Lit> __l_00;
  initializer_list<Lit> __l_01;
  initializer_list<Lit> __l_02;
  initializer_list<Lit> __l_03;
  initializer_list<Lit> __l_04;
  initializer_list<Lit> __l_05;
  initializer_list<Lit> __l_06;
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int64_t iVar6;
  int64_t iVar7;
  Clause *pCVar8;
  vector<Lit,_std::allocator<Lit>_> *__x;
  long v;
  Lit *pLVar9;
  long in_RDI;
  Clause *r_8;
  Clause *r_7;
  anon_class_16_2_f8370e7b reason_1;
  int64_t cur_m_1;
  uint i_3;
  int best_1;
  int64_t new_m_1;
  int64_t old_m_1;
  Clause *r_6;
  Clause *r_5;
  anon_class_16_2_f8370e7b reason;
  int64_t cur_m;
  uint i_2;
  int best;
  int64_t new_m;
  int64_t old_m;
  Clause *r_4;
  uint i_1;
  bool push_max;
  bool push_min;
  vector<Lit,_std::allocator<Lit>_> expl;
  Reason m_r_5;
  int64_t m_v_5;
  Clause *r_3;
  Reason m_r_4;
  int64_t m_v_4;
  Clause *r_2;
  uint i;
  Clause *r_1;
  Clause *r;
  Reason m_r_3;
  int64_t m_v_3;
  Reason m_r_2;
  int64_t m_v_2;
  Reason m_r_1;
  int64_t m_v_1;
  Reason m_r;
  int64_t m_v;
  IntView<0> *f;
  BoolView *in_stack_fffffffffffffab8;
  BoolView *in_stack_fffffffffffffac0;
  undefined1 uVar10;
  BoolView *in_stack_fffffffffffffac8;
  IntView<0> *this_00;
  undefined4 in_stack_fffffffffffffad0;
  Lit in_stack_fffffffffffffad4;
  undefined8 in_stack_fffffffffffffad8;
  anon_class_16_2_f8370e7b *in_stack_fffffffffffffae0;
  allocator_type *in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  iterator in_stack_fffffffffffffaf8;
  size_type in_stack_fffffffffffffb00;
  Lit in_stack_fffffffffffffb10;
  Lit in_stack_fffffffffffffb14;
  Reason local_3e8;
  int local_3dc;
  Clause *local_3d8;
  Reason local_3d0;
  int local_3c4;
  Clause *local_3c0;
  IntView<0> **local_3b0;
  IntView<0> *local_3a8;
  uint local_3a0;
  uint local_39c;
  IntView<0> *local_398;
  int64_t local_390;
  Reason local_388;
  int local_37c;
  Clause *local_378;
  Reason local_370;
  int local_364;
  Clause *local_360;
  int64_t *local_350;
  int64_t local_348;
  uint local_340;
  uint local_33c;
  int64_t local_338;
  int64_t local_330;
  uint local_324;
  Reason local_320 [4];
  Clause *local_300;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  uint local_2e0;
  byte local_2da;
  byte local_2d9;
  anon_union_8_2_743a5d44_for_Reason_0 local_2c0;
  anon_union_8_2_743a5d44_for_Reason_0 local_2b8;
  ulong local_2b0;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int *local_298;
  undefined8 local_290;
  Clause *local_270;
  anon_union_8_2_743a5d44_for_Reason_0 local_268;
  anon_union_8_2_743a5d44_for_Reason_0 local_260;
  ulong local_258;
  int local_24c;
  int local_248;
  int local_244;
  int *local_240;
  undefined8 local_238;
  Clause *local_218;
  uint local_20c;
  Reason local_208;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int *local_1f0;
  undefined8 local_1e8;
  Clause *local_1c8;
  Reason local_1c0;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int *local_1a8;
  undefined8 local_1a0;
  Clause *local_180;
  anon_union_8_2_743a5d44_for_Reason_0 local_178;
  int local_16c;
  int local_168;
  int local_164;
  int *local_160;
  undefined8 local_158;
  anon_union_8_2_743a5d44_for_Reason_0 local_138;
  int64_t local_130;
  anon_union_8_2_743a5d44_for_Reason_0 local_128;
  int local_11c;
  int local_118;
  int local_114;
  int *local_110;
  undefined8 local_108;
  anon_union_8_2_743a5d44_for_Reason_0 local_e8;
  int64_t local_e0;
  anon_union_8_2_743a5d44_for_Reason_0 local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  int *local_c0;
  undefined8 local_b8;
  anon_union_8_2_743a5d44_for_Reason_0 local_98;
  int64_t local_90;
  anon_union_8_2_743a5d44_for_Reason_0 local_88;
  int local_6c;
  int local_68;
  int local_64;
  int *local_60;
  undefined8 local_58;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  int64_t local_30;
  IntView<0> *local_28;
  int local_1c;
  byte local_1;
  
  bVar1 = BoolView::isFixed((BoolView *)0x25bed8);
  if ((bVar1) && (bVar1 = BoolView::isFalse(in_stack_fffffffffffffac0), bVar1)) {
    Tchar::operator=((Tchar *)in_stack_fffffffffffffae0,
                     (char)((ulong)in_stack_fffffffffffffad8 >> 0x38));
    local_1 = 1;
    goto LAB_0025da57;
  }
  cVar2 = Tchar::operator_cast_to_char((Tchar *)(in_RDI + 0x58));
  if (cVar2 != '\0') {
    iVar3 = Tint::operator_cast_to_int((Tint *)(in_RDI + 100));
    if (-1 < iVar3) {
      iVar3 = Tint::operator_cast_to_int((Tint *)(in_RDI + 100));
      uVar4 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x48));
      if (iVar3 < (int)uVar4) goto LAB_0025bfe1;
    }
    uVar10 = (undefined1)((ulong)in_stack_fffffffffffffac0 >> 0x38);
    local_1c = (int)IntView<0>::getValLit((IntView<0> *)in_stack_fffffffffffffab8);
    Reason::Reason((Reason *)in_stack_fffffffffffffac8,in_stack_fffffffffffffad4);
    r_00.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
    r_00.field_0._a._0_4_ = in_stack_fffffffffffffad0;
    local_1 = BoolView::setVal(in_stack_fffffffffffffac8,(bool)uVar10,r_00);
    goto LAB_0025da57;
  }
LAB_0025bfe1:
  cVar2 = Tchar::operator_cast_to_char((Tchar *)(in_RDI + 0x58));
  if (cVar2 == '\0') {
    bVar1 = BoolView::isFixed((BoolView *)0x25cb66);
    if (bVar1) {
      for (local_20c = 0; uVar4 = local_20c,
          uVar5 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x48)), uVar4 < uVar5;
          local_20c = local_20c + 1) {
        bVar1 = IntView<0>::indomain
                          ((IntView<0> *)in_stack_fffffffffffffac0,
                           (int64_t)in_stack_fffffffffffffab8);
        if (bVar1) {
          iVar6 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
          vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),local_20c);
          iVar7 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffac0);
          if (iVar6 < iVar7) {
            local_24c = (int)BoolView::getValLit(in_stack_fffffffffffffab8);
            vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),local_20c);
            local_248 = (int)IntView<0>::getMinLit((IntView<0> *)in_stack_fffffffffffffab8);
            local_244 = (int)IntView<0>::getMaxLit((IntView<0> *)in_stack_fffffffffffffab8);
            local_240 = &local_24c;
            local_238 = 3;
            std::allocator<Lit>::allocator((allocator<Lit> *)0x25cca2);
            __l_05._M_len = in_stack_fffffffffffffb00;
            __l_05._M_array = in_stack_fffffffffffffaf8;
            std::vector<Lit,_std::allocator<Lit>_>::vector
                      ((vector<Lit,_std::allocator<Lit>_> *)
                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),__l_05,
                       in_stack_fffffffffffffae8);
            pCVar8 = ::Reason_new((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffae0);
            std::vector<Lit,_std::allocator<Lit>_>::~vector
                      ((vector<Lit,_std::allocator<Lit>_> *)
                       CONCAT44(in_stack_fffffffffffffad4.x,in_stack_fffffffffffffad0));
            std::allocator<Lit>::~allocator((allocator<Lit> *)0x25ccfa);
            local_258 = (ulong)local_20c;
            local_218 = pCVar8;
            bVar1 = IntView<0>::remValNotR
                              ((IntView<0> *)in_stack_fffffffffffffac0,
                               (int64_t)in_stack_fffffffffffffab8);
            if (bVar1) {
              Reason::Reason((Reason *)&local_260,(Clause *)0x0);
              if ((so.lazy & 1U) != 0) {
                Reason::Reason((Reason *)&local_260,local_218);
              }
              local_268 = local_260;
              r_07.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
              r_07.field_0._a._0_4_ = in_stack_fffffffffffffad0;
              bVar1 = IntView<0>::remVal((IntView<0> *)in_stack_fffffffffffffac8,
                                         (int64_t)in_stack_fffffffffffffac0,r_07,
                                         SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
              if (!bVar1) {
                local_1 = 0;
                goto LAB_0025da57;
              }
            }
          }
          iVar6 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffac0);
          vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),local_20c);
          iVar7 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
          if (iVar7 < iVar6) {
            local_2a4 = (int)BoolView::getValLit(in_stack_fffffffffffffab8);
            vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),local_20c);
            local_2a0 = (int)IntView<0>::getMaxLit((IntView<0> *)in_stack_fffffffffffffab8);
            local_29c = (int)IntView<0>::getMinLit((IntView<0> *)in_stack_fffffffffffffab8);
            local_298 = &local_2a4;
            local_290 = 3;
            std::allocator<Lit>::allocator((allocator<Lit> *)0x25cedb);
            __l_06._M_len = in_stack_fffffffffffffb00;
            __l_06._M_array = in_stack_fffffffffffffaf8;
            std::vector<Lit,_std::allocator<Lit>_>::vector
                      ((vector<Lit,_std::allocator<Lit>_> *)
                       CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),__l_06,
                       in_stack_fffffffffffffae8);
            pCVar8 = ::Reason_new((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffae0);
            std::vector<Lit,_std::allocator<Lit>_>::~vector
                      ((vector<Lit,_std::allocator<Lit>_> *)
                       CONCAT44(in_stack_fffffffffffffad4.x,in_stack_fffffffffffffad0));
            std::allocator<Lit>::~allocator((allocator<Lit> *)0x25cf33);
            local_2b0 = (ulong)local_20c;
            local_270 = pCVar8;
            bVar1 = IntView<0>::remValNotR
                              ((IntView<0> *)in_stack_fffffffffffffac0,
                               (int64_t)in_stack_fffffffffffffab8);
            if (bVar1) {
              Reason::Reason((Reason *)&local_2b8,(Clause *)0x0);
              if ((so.lazy & 1U) != 0) {
                Reason::Reason((Reason *)&local_2b8,local_270);
              }
              local_2c0 = local_2b8;
              r_08.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
              r_08.field_0._a._0_4_ = in_stack_fffffffffffffad0;
              bVar1 = IntView<0>::remVal((IntView<0> *)in_stack_fffffffffffffac8,
                                         (int64_t)in_stack_fffffffffffffac0,r_08,
                                         SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
              if (!bVar1) {
                local_1 = 0;
                goto LAB_0025da57;
              }
            }
          }
        }
      }
    }
    else {
      std::vector<Lit,_std::allocator<Lit>_>::vector((vector<Lit,_std::allocator<Lit>_> *)0x25d069);
      local_2d9 = 0;
      local_2da = 0;
      for (local_2e0 = 0; uVar4 = local_2e0,
          uVar5 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x48)), uVar4 <= uVar5;
          local_2e0 = local_2e0 + 1) {
        bVar1 = IntView<0>::indomain
                          ((IntView<0> *)in_stack_fffffffffffffac0,
                           (int64_t)in_stack_fffffffffffffab8);
        if (bVar1) {
          iVar6 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
          vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),local_2e0);
          iVar7 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffac0);
          if (iVar6 < iVar7) {
            if ((local_2da & 1) == 0) {
              local_2e8 = (int)IntView<0>::getMaxLit((IntView<0> *)in_stack_fffffffffffffab8);
              std::vector<Lit,_std::allocator<Lit>_>::push_back
                        ((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffac0,
                         (value_type *)in_stack_fffffffffffffab8);
              local_2da = 1;
            }
            vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),local_2e0);
            local_2ec = (int)IntView<0>::getMinLit((IntView<0> *)in_stack_fffffffffffffab8);
            std::vector<Lit,_std::allocator<Lit>_>::push_back
                      ((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffac0,
                       (value_type *)in_stack_fffffffffffffab8);
          }
          else {
            iVar6 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffac0);
            vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),local_2e0);
            iVar7 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
            if (iVar6 <= iVar7) break;
            if ((local_2d9 & 1) == 0) {
              in_stack_fffffffffffffb14 =
                   IntView<0>::getMinLit((IntView<0> *)in_stack_fffffffffffffab8);
              local_2f0 = in_stack_fffffffffffffb14.x;
              std::vector<Lit,_std::allocator<Lit>_>::push_back
                        ((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffac0,
                         (value_type *)in_stack_fffffffffffffab8);
              local_2d9 = 1;
            }
            vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),local_2e0);
            in_stack_fffffffffffffb10 =
                 IntView<0>::getMaxLit((IntView<0> *)in_stack_fffffffffffffab8);
            local_2f4 = in_stack_fffffffffffffb10.x;
            std::vector<Lit,_std::allocator<Lit>_>::push_back
                      ((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffac0,
                       (value_type *)in_stack_fffffffffffffab8);
          }
        }
        else {
          local_2e4 = (int)IntView<0>::getLit((IntView<0> *)in_stack_fffffffffffffac8,
                                              (int64_t)in_stack_fffffffffffffac0,
                                              (int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
          std::vector<Lit,_std::allocator<Lit>_>::push_back
                    ((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffac0,
                     (value_type *)in_stack_fffffffffffffab8);
        }
      }
      __x = (vector<Lit,_std::allocator<Lit>_> *)(ulong)local_2e0;
      iVar6 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
      if (iVar6 < (long)__x) {
        std::vector<Lit,_std::allocator<Lit>_>::vector
                  ((vector<Lit,_std::allocator<Lit>_> *)
                   CONCAT44(in_stack_fffffffffffffb14.x,in_stack_fffffffffffffb10.x),__x);
        pCVar8 = ::Reason_new((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffae0);
        std::vector<Lit,_std::allocator<Lit>_>::~vector
                  ((vector<Lit,_std::allocator<Lit>_> *)
                   CONCAT44(in_stack_fffffffffffffad4.x,in_stack_fffffffffffffad0));
        local_300 = pCVar8;
        Reason::Reason(local_320,pCVar8);
        r_09.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
        r_09.field_0._a._0_4_ = in_stack_fffffffffffffad0;
        local_1 = BoolView::setVal(in_stack_fffffffffffffac8,
                                   SUB81((ulong)in_stack_fffffffffffffac0 >> 0x38,0),r_09);
      }
      local_324 = (uint)(iVar6 < (long)__x);
      std::vector<Lit,_std::allocator<Lit>_>::~vector
                ((vector<Lit,_std::allocator<Lit>_> *)
                 CONCAT44(in_stack_fffffffffffffad4.x,in_stack_fffffffffffffad0));
      if (local_324 != 0) goto LAB_0025da57;
    }
    if ((*(byte *)(in_RDI + 0x68) & 1) != 0) {
      local_330 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffac0);
      local_338 = 0x7fffffffffffffff;
      local_33c = 0xffffffff;
      local_340 = 0;
      while (uVar4 = local_340, uVar5 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x48)),
            uVar4 < uVar5) {
        bVar1 = IntView<0>::indomain
                          ((IntView<0> *)in_stack_fffffffffffffac0,
                           (int64_t)in_stack_fffffffffffffab8);
        if (bVar1) {
          vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),local_340);
          local_348 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffac0);
          if ((local_348 < local_338) &&
             (local_33c = local_340, local_338 = local_348, local_348 <= local_330)) break;
        }
        local_340 = local_340 + 1;
      }
      Tint::operator=((Tint *)in_stack_fffffffffffffae0,
                      (int)((ulong)in_stack_fffffffffffffad8 >> 0x20));
      bVar1 = IntView<0>::setMinNotR
                        ((IntView<0> *)in_stack_fffffffffffffac0,(int64_t)in_stack_fffffffffffffab8)
      ;
      if (bVar1) {
        local_350 = &local_338;
        bVar1 = BoolView::isFixed((BoolView *)0x25d5d6);
        if (bVar1) {
          local_360 = propagate::anon_class_16_2_f8370e7b::operator()(in_stack_fffffffffffffae0);
          local_364 = (int)BoolView::getValLit(in_stack_fffffffffffffab8);
          pLVar9 = Clause::operator[]((Clause *)in_stack_fffffffffffffac0,
                                      (int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
          pLVar9->x = local_364;
          in_stack_fffffffffffffae0 = (anon_class_16_2_f8370e7b *)(in_RDI + 0x28);
          Reason::Reason(&local_370,local_360);
          r_10.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
          r_10.field_0._a._0_4_ = in_stack_fffffffffffffad0;
          bVar1 = IntView<0>::setMin((IntView<0> *)in_stack_fffffffffffffac8,
                                     (int64_t)in_stack_fffffffffffffac0,r_10,
                                     SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            local_1 = 0;
            goto LAB_0025da57;
          }
        }
        else {
          iVar6 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
          if (iVar6 < local_338) {
            local_378 = propagate::anon_class_16_2_f8370e7b::operator()(in_stack_fffffffffffffae0);
            local_37c = (int)IntView<0>::getMaxLit((IntView<0> *)in_stack_fffffffffffffab8);
            pLVar9 = Clause::operator[]((Clause *)in_stack_fffffffffffffac0,
                                        (int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
            uVar10 = (undefined1)((ulong)in_stack_fffffffffffffac0 >> 0x38);
            pLVar9->x = local_37c;
            Reason::Reason(&local_388,local_378);
            r_11.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
            r_11.field_0._a._0_4_ = in_stack_fffffffffffffad0;
            local_1 = BoolView::setVal(in_stack_fffffffffffffac8,(bool)uVar10,r_11);
            goto LAB_0025da57;
          }
        }
      }
      *(undefined1 *)(in_RDI + 0x68) = 0;
    }
    if ((*(byte *)(in_RDI + 0x69) & 1) != 0) {
      local_390 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
      local_398 = (IntView<0> *)0xffffffff80000000;
      local_39c = 0xffffffff;
      local_3a0 = 0;
      while( true ) {
        uVar4 = local_3a0;
        uVar5 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x48));
        iVar3 = (int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
        if (uVar5 <= uVar4) break;
        bVar1 = IntView<0>::indomain
                          ((IntView<0> *)in_stack_fffffffffffffac0,
                           (int64_t)in_stack_fffffffffffffab8);
        if (bVar1) {
          vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),local_3a0);
          local_3a8 = (IntView<0> *)IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
          iVar3 = (int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
          if (((long)local_398 < (long)local_3a8) &&
             (local_39c = local_3a0, local_398 = local_3a8, local_390 <= (long)local_3a8)) break;
        }
        local_3a0 = local_3a0 + 1;
      }
      Tint::operator=((Tint *)in_stack_fffffffffffffae0,iVar3);
      bVar1 = IntView<0>::setMaxNotR
                        ((IntView<0> *)in_stack_fffffffffffffac0,(int64_t)in_stack_fffffffffffffab8)
      ;
      if (bVar1) {
        local_3b0 = &local_398;
        bVar1 = BoolView::isFixed((BoolView *)0x25d8d5);
        if (bVar1) {
          local_3c0 = propagate::anon_class_16_2_f8370e7b::operator()(in_stack_fffffffffffffae0);
          local_3c4 = (int)BoolView::getValLit(in_stack_fffffffffffffab8);
          pLVar9 = Clause::operator[]((Clause *)in_stack_fffffffffffffac0,
                                      (int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
          uVar10 = (undefined1)((ulong)in_stack_fffffffffffffab8 >> 0x38);
          pLVar9->x = local_3c4;
          v = in_RDI + 0x28;
          this_00 = local_398;
          Reason::Reason(&local_3d0,local_3c0);
          r_12.field_0._a._4_4_ = uVar4;
          r_12.field_0._a._0_4_ = in_stack_fffffffffffffad0;
          bVar1 = IntView<0>::setMax(this_00,v,r_12,(bool)uVar10);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            local_1 = 0;
            goto LAB_0025da57;
          }
        }
        else {
          iVar6 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffac0);
          if ((long)local_398 < iVar6) {
            local_3d8 = propagate::anon_class_16_2_f8370e7b::operator()(in_stack_fffffffffffffae0);
            local_3dc = (int)IntView<0>::getMinLit((IntView<0> *)in_stack_fffffffffffffab8);
            pLVar9 = Clause::operator[]((Clause *)in_stack_fffffffffffffac0,
                                        (int)((ulong)in_stack_fffffffffffffab8 >> 0x20));
            uVar10 = (undefined1)((ulong)in_stack_fffffffffffffac0 >> 0x38);
            pLVar9->x = local_3dc;
            Reason::Reason(&local_3e8,local_3d8);
            r_13.field_0._a._4_4_ = uVar4;
            r_13.field_0._a._0_4_ = in_stack_fffffffffffffad0;
            local_1 = BoolView::setVal(in_stack_fffffffffffffac8,(bool)uVar10,r_13);
            goto LAB_0025da57;
          }
        }
      }
      *(undefined1 *)(in_RDI + 0x69) = 0;
    }
    local_1 = 1;
    goto LAB_0025da57;
  }
  uVar4 = Tint::operator_cast_to_int((Tint *)(in_RDI + 100));
  cVar2 = (char)((ulong)in_stack_fffffffffffffad8 >> 0x38);
  local_28 = vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x48),uVar4);
  bVar1 = BoolView::isFixed((BoolView *)0x25c046);
  if (bVar1) {
    local_30 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffac0);
    bVar1 = IntView<0>::setMinNotR
                      ((IntView<0> *)in_stack_fffffffffffffac0,(int64_t)in_stack_fffffffffffffab8);
    if (bVar1) {
      Reason::Reason((Reason *)&local_38,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_6c = (int)BoolView::getValLit(in_stack_fffffffffffffab8);
        local_68 = (int)IntView<0>::getMinLit((IntView<0> *)in_stack_fffffffffffffab8);
        local_64 = (int)IntView<0>::getValLit((IntView<0> *)in_stack_fffffffffffffab8);
        local_60 = &local_6c;
        local_58 = 3;
        std::allocator<Lit>::allocator((allocator<Lit> *)0x25c11f);
        __l._M_len = in_stack_fffffffffffffb00;
        __l._M_array = in_stack_fffffffffffffaf8;
        std::vector<Lit,_std::allocator<Lit>_>::vector
                  ((vector<Lit,_std::allocator<Lit>_> *)
                   CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),__l,
                   in_stack_fffffffffffffae8);
        pCVar8 = ::Reason_new((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffae0);
        Reason::Reason((Reason *)&local_38,pCVar8);
        std::vector<Lit,_std::allocator<Lit>_>::~vector
                  ((vector<Lit,_std::allocator<Lit>_> *)
                   CONCAT44(in_stack_fffffffffffffad4.x,in_stack_fffffffffffffad0));
        std::allocator<Lit>::~allocator((allocator<Lit> *)0x25c18e);
      }
      local_88 = local_38;
      r_01.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
      r_01.field_0._a._0_4_ = in_stack_fffffffffffffad0;
      bVar1 = IntView<0>::setMin((IntView<0> *)in_stack_fffffffffffffac8,
                                 (int64_t)in_stack_fffffffffffffac0,r_01,
                                 SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0025da57;
      }
    }
    local_90 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffac0);
    bVar1 = IntView<0>::setMinNotR
                      ((IntView<0> *)in_stack_fffffffffffffac0,(int64_t)in_stack_fffffffffffffab8);
    if (bVar1) {
      Reason::Reason((Reason *)&local_98,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_cc = (int)BoolView::getValLit(in_stack_fffffffffffffab8);
        local_c8 = (int)IntView<0>::getMinLit((IntView<0> *)in_stack_fffffffffffffab8);
        local_c4 = (int)IntView<0>::getValLit((IntView<0> *)in_stack_fffffffffffffab8);
        local_c0 = &local_cc;
        local_b8 = 3;
        std::allocator<Lit>::allocator((allocator<Lit> *)0x25c2f8);
        __l_00._M_len = in_stack_fffffffffffffb00;
        __l_00._M_array = in_stack_fffffffffffffaf8;
        std::vector<Lit,_std::allocator<Lit>_>::vector
                  ((vector<Lit,_std::allocator<Lit>_> *)
                   CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),__l_00,
                   in_stack_fffffffffffffae8);
        pCVar8 = ::Reason_new((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffae0);
        Reason::Reason((Reason *)&local_98,pCVar8);
        std::vector<Lit,_std::allocator<Lit>_>::~vector
                  ((vector<Lit,_std::allocator<Lit>_> *)
                   CONCAT44(in_stack_fffffffffffffad4.x,in_stack_fffffffffffffad0));
        std::allocator<Lit>::~allocator((allocator<Lit> *)0x25c367);
      }
      local_d8 = local_98;
      r_02.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
      r_02.field_0._a._0_4_ = in_stack_fffffffffffffad0;
      bVar1 = IntView<0>::setMin((IntView<0> *)in_stack_fffffffffffffac8,
                                 (int64_t)in_stack_fffffffffffffac0,r_02,
                                 SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0025da57;
      }
    }
    local_e0 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
    bVar1 = IntView<0>::setMaxNotR
                      ((IntView<0> *)in_stack_fffffffffffffac0,(int64_t)in_stack_fffffffffffffab8);
    if (bVar1) {
      Reason::Reason((Reason *)&local_e8,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_11c = (int)BoolView::getValLit(in_stack_fffffffffffffab8);
        local_118 = (int)IntView<0>::getMaxLit((IntView<0> *)in_stack_fffffffffffffab8);
        local_114 = (int)IntView<0>::getValLit((IntView<0> *)in_stack_fffffffffffffab8);
        local_110 = &local_11c;
        local_108 = 3;
        std::allocator<Lit>::allocator((allocator<Lit> *)0x25c4c9);
        __l_01._M_len = in_stack_fffffffffffffb00;
        __l_01._M_array = in_stack_fffffffffffffaf8;
        std::vector<Lit,_std::allocator<Lit>_>::vector
                  ((vector<Lit,_std::allocator<Lit>_> *)
                   CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),__l_01,
                   in_stack_fffffffffffffae8);
        pCVar8 = ::Reason_new((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffae0);
        Reason::Reason((Reason *)&local_e8,pCVar8);
        std::vector<Lit,_std::allocator<Lit>_>::~vector
                  ((vector<Lit,_std::allocator<Lit>_> *)
                   CONCAT44(in_stack_fffffffffffffad4.x,in_stack_fffffffffffffad0));
        std::allocator<Lit>::~allocator((allocator<Lit> *)0x25c538);
      }
      local_128 = local_e8;
      r_03.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
      r_03.field_0._a._0_4_ = in_stack_fffffffffffffad0;
      bVar1 = IntView<0>::setMax((IntView<0> *)in_stack_fffffffffffffac8,
                                 (int64_t)in_stack_fffffffffffffac0,r_03,
                                 SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0025da57;
      }
    }
    local_130 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
    bVar1 = IntView<0>::setMaxNotR
                      ((IntView<0> *)in_stack_fffffffffffffac0,(int64_t)in_stack_fffffffffffffab8);
    if (bVar1) {
      Reason::Reason((Reason *)&local_138,(Clause *)0x0);
      if ((so.lazy & 1U) != 0) {
        local_16c = (int)BoolView::getValLit(in_stack_fffffffffffffab8);
        local_168 = (int)IntView<0>::getMaxLit((IntView<0> *)in_stack_fffffffffffffab8);
        local_164 = (int)IntView<0>::getValLit((IntView<0> *)in_stack_fffffffffffffab8);
        local_160 = &local_16c;
        local_158 = 3;
        std::allocator<Lit>::allocator((allocator<Lit> *)0x25c6a2);
        __l_02._M_len = in_stack_fffffffffffffb00;
        __l_02._M_array = in_stack_fffffffffffffaf8;
        std::vector<Lit,_std::allocator<Lit>_>::vector
                  ((vector<Lit,_std::allocator<Lit>_> *)
                   CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),__l_02,
                   in_stack_fffffffffffffae8);
        pCVar8 = ::Reason_new((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffae0);
        Reason::Reason((Reason *)&local_138,pCVar8);
        std::vector<Lit,_std::allocator<Lit>_>::~vector
                  ((vector<Lit,_std::allocator<Lit>_> *)
                   CONCAT44(in_stack_fffffffffffffad4.x,in_stack_fffffffffffffad0));
        std::allocator<Lit>::~allocator((allocator<Lit> *)0x25c711);
      }
      local_178 = local_138;
      r_04.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
      r_04.field_0._a._0_4_ = in_stack_fffffffffffffad0;
      bVar1 = IntView<0>::setMax((IntView<0> *)in_stack_fffffffffffffac8,
                                 (int64_t)in_stack_fffffffffffffac0,r_04,
                                 SUB81((ulong)in_stack_fffffffffffffab8 >> 0x38,0));
      if (!bVar1) {
        local_1 = 0;
        goto LAB_0025da57;
      }
    }
    bVar1 = IntView<0>::isFixed((IntView<0> *)0x25c7b4);
    if ((bVar1) && (bVar1 = IntView<0>::isFixed((IntView<0> *)0x25c7c7), bVar1)) {
      Tchar::operator=((Tchar *)in_stack_fffffffffffffae0,cVar2);
    }
  }
  else {
    iVar6 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffac0);
    iVar7 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
    if (iVar7 < iVar6) {
      local_1b4 = (int)IntView<0>::getValLit((IntView<0> *)in_stack_fffffffffffffab8);
      uVar10 = (undefined1)((ulong)in_stack_fffffffffffffac0 >> 0x38);
      local_1b0 = (int)IntView<0>::getMinLit((IntView<0> *)in_stack_fffffffffffffab8);
      local_1ac = (int)IntView<0>::getMaxLit((IntView<0> *)in_stack_fffffffffffffab8);
      local_1a8 = &local_1b4;
      local_1a0 = 3;
      std::allocator<Lit>::allocator((allocator<Lit> *)0x25c897);
      __l_03._M_len = in_stack_fffffffffffffb00;
      __l_03._M_array = in_stack_fffffffffffffaf8;
      std::vector<Lit,_std::allocator<Lit>_>::vector
                ((vector<Lit,_std::allocator<Lit>_> *)
                 CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),__l_03,
                 in_stack_fffffffffffffae8);
      pCVar8 = ::Reason_new((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffae0);
      std::vector<Lit,_std::allocator<Lit>_>::~vector
                ((vector<Lit,_std::allocator<Lit>_> *)
                 CONCAT44(in_stack_fffffffffffffad4.x,in_stack_fffffffffffffad0));
      std::allocator<Lit>::~allocator((allocator<Lit> *)0x25c8ef);
      local_180 = pCVar8;
      Reason::Reason(&local_1c0,pCVar8);
      r_05.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
      r_05.field_0._a._0_4_ = in_stack_fffffffffffffad0;
      local_1 = BoolView::setVal(in_stack_fffffffffffffac8,(bool)uVar10,r_05);
      goto LAB_0025da57;
    }
    iVar6 = IntView<0>::getMax((IntView<0> *)in_stack_fffffffffffffac0);
    iVar7 = IntView<0>::getMin((IntView<0> *)in_stack_fffffffffffffac0);
    uVar10 = (undefined1)((ulong)in_stack_fffffffffffffac0 >> 0x38);
    if (iVar6 < iVar7) {
      local_1fc = (int)IntView<0>::getValLit((IntView<0> *)in_stack_fffffffffffffab8);
      local_1f8 = (int)IntView<0>::getMaxLit((IntView<0> *)in_stack_fffffffffffffab8);
      local_1f4 = (int)IntView<0>::getMinLit((IntView<0> *)in_stack_fffffffffffffab8);
      local_1f0 = &local_1fc;
      local_1e8 = 3;
      std::allocator<Lit>::allocator((allocator<Lit> *)0x25ca45);
      __l_04._M_len = in_stack_fffffffffffffb00;
      __l_04._M_array = in_stack_fffffffffffffaf8;
      std::vector<Lit,_std::allocator<Lit>_>::vector
                ((vector<Lit,_std::allocator<Lit>_> *)
                 CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),__l_04,
                 in_stack_fffffffffffffae8);
      pCVar8 = ::Reason_new((vector<Lit,_std::allocator<Lit>_> *)in_stack_fffffffffffffae0);
      std::vector<Lit,_std::allocator<Lit>_>::~vector
                ((vector<Lit,_std::allocator<Lit>_> *)
                 CONCAT44(in_stack_fffffffffffffad4.x,in_stack_fffffffffffffad0));
      std::allocator<Lit>::~allocator((allocator<Lit> *)0x25ca9d);
      local_1c8 = pCVar8;
      Reason::Reason(&local_208,pCVar8);
      r_06.field_0._a._4_4_ = in_stack_fffffffffffffad4.x;
      r_06.field_0._a._0_4_ = in_stack_fffffffffffffad0;
      local_1 = BoolView::setVal(in_stack_fffffffffffffac8,(bool)uVar10,r_06);
      goto LAB_0025da57;
    }
  }
  local_1 = 1;
LAB_0025da57:
  return (bool)(local_1 & 1);
}

Assistant:

bool propagate() override {
		if (b.isFixed() && b.isFalse()) {
			satisfied = true;
			return true;
		}

		// x is out of bounds
		if ((is_fixed != 0) && (fixed_index < 0 || fixed_index >= static_cast<int>(a.size()))) {
			return b.setVal(false, x.getValLit());
		}

		// y = a[fixed_index]
		if (is_fixed != 0) {
			assert(x.getVal() == fixed_index);
			const IntView<W>& f = a[fixed_index];
			if (b.isFixed()) {
				setDom(y, setMin, f.getMin(), Reason_new({b.getValLit(), f.getMinLit(), x.getValLit()}));
				setDom(f, setMin, y.getMin(), Reason_new({b.getValLit(), y.getMinLit(), x.getValLit()}));
				setDom(y, setMax, f.getMax(), Reason_new({b.getValLit(), f.getMaxLit(), x.getValLit()}));
				setDom(f, setMax, y.getMax(), Reason_new({b.getValLit(), y.getMaxLit(), x.getValLit()}));
				if (y.isFixed() && f.isFixed()) {
					satisfied = true;
				}
			} else if (f.getMin() > y.getMax()) {
				Clause* r = Reason_new({x.getValLit(), f.getMinLit(), y.getMaxLit()});
				return b.setVal(false, r);
			} else if (f.getMax() < y.getMin()) {
				Clause* r = Reason_new({x.getValLit(), f.getMaxLit(), y.getMinLit()});
				return b.setVal(false, r);
			}
			return true;
		}

		if (b.isFixed()) {
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				if (y.getMax() < a[i].getMin()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMinLit(), y.getMaxLit()});
					setDom(x, remVal, i, r);
				}
				if (y.getMin() > a[i].getMax()) {
					Clause* r = Reason_new({b.getValLit(), a[i].getMaxLit(), y.getMinLit()});
					setDom(x, remVal, i, r);
				}
			}
		} else {
			std::vector<Lit> expl;
			bool push_min = false;
			bool push_max = false;
			unsigned int i = 0;
			while (i <= a.size()) {
				if (!x.indomain(i)) {
					expl.push_back(x.getLit(i, LR_EQ));
				} else if (y.getMax() < a[i].getMin()) {
					if (!push_max) {
						expl.push_back(y.getMaxLit());
						push_max = true;
					}
					expl.push_back(a[i].getMinLit());
				} else if (y.getMin() > a[i].getMax()) {
					if (!push_min) {
						expl.push_back(y.getMinLit());
						push_min = true;
					}
					expl.push_back(a[i].getMaxLit());
				} else {
					break;
				}
				i++;
			}
			if (i > x.getMax()) {
				Clause* r = Reason_new(expl);
				return b.setVal(false, r);
			}
		}

		if (no_min_support) {
			const int64_t old_m = y.getMin();
			int64_t new_m = INT64_MAX;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMin();
				if (cur_m < new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m <= old_m) {
						break;
					}
				}
			}
			min_support = best;
			if (y.setMinNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse lower bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMinLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMin(new_m, r)) {
						return false;
					}
				} else if (y.getMax() < new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMaxLit();
					return b.setVal(false, r);
				}
			}
			no_min_support = false;
		}

		if (no_max_support) {
			const int64_t old_m = y.getMax();
			int64_t new_m = INT_MIN;
			int best = -1;
			for (unsigned int i = 0; i < a.size(); i++) {
				if (!x.indomain(i)) {
					continue;
				}
				const int64_t cur_m = a[i].getMax();
				if (cur_m > new_m) {
					best = i;
					new_m = cur_m;
					if (cur_m >= old_m) {
						break;
					}
				}
			}
			max_support = best;
			if (y.setMaxNotR(new_m)) {
				auto reason = [&] {
					Clause* r = nullptr;
					if (so.lazy) {
						r = Reason_new(a.size() + 2);
						// Finesse upper bounds
						for (unsigned int i = 0; i < a.size(); i++) {
							(*r)[i + 2] = x.indomain(i) ? a[i].getFMaxLit(new_m) : x.getLit(i, LR_EQ);
						}
					}
					return r;
				};
				if (b.isFixed()) {
					Clause* r = reason();
					(*r)[1] = b.getValLit();
					if (!y.setMax(new_m, r)) {
						return false;
					}
				} else if (y.getMin() > new_m) {
					Clause* r = reason();
					(*r)[1] = y.getMinLit();
					return b.setVal(false, r);
				}
			}
			no_max_support = false;
		}

		return true;
	}